

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O0

double ** __thiscall
Atmosphere::tabulate(Atmosphere *this,double h_start,double h_end,double h_step)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  double **ppdVar4;
  double *pdVar5;
  reference pvVar6;
  array<double,_3UL> local_80;
  double local_68;
  double h;
  int j;
  int i;
  array<double,_3UL> temp;
  int i_1;
  double **result;
  int size;
  double h_step_local;
  double h_end_local;
  double h_start_local;
  Atmosphere *this_local;
  
  iVar2 = (int)((h_end - h_start) / h_step + 1.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppdVar4 = (double **)operator_new__(uVar3);
  for (temp._M_elems[2]._4_4_ = 0; temp._M_elems[2]._4_4_ < iVar2;
      temp._M_elems[2]._4_4_ = temp._M_elems[2]._4_4_ + 1) {
    pdVar5 = (double *)operator_new__(0x20);
    ppdVar4[temp._M_elems[2]._4_4_] = pdVar5;
  }
  memset(&j,0,0x18);
  h._4_4_ = 0;
  h._0_4_ = 0;
  for (local_68 = h_start; local_68 <= h_end; local_68 = h_step + local_68) {
    calculate(&local_80,this,local_68);
    _j = local_80._M_elems[0];
    temp._M_elems[0] = local_80._M_elems[1];
    temp._M_elems[1] = local_80._M_elems[2];
    *ppdVar4[h._4_4_] = local_68;
    for (h._0_4_ = 0; h._0_4_ < 3; h._0_4_ = h._0_4_ + 1) {
      pvVar6 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)&j,(long)h._0_4_);
      ppdVar4[h._4_4_][h._0_4_ + 1] = *pvVar6;
    }
    h._4_4_ = h._4_4_ + 1;
  }
  return ppdVar4;
}

Assistant:

double **tabulate(double h_start, double h_end, double h_step) {

        const int size = (const int) ((h_end - h_start) / h_step + 1);
        auto **result = new double *[size];
        for (int i = 0; i < size; ++i) {
            result[i] = new double[4];
        }

        std::array<double, 3> temp{};

        int i = 0, j = 0;
        double h = h_start;
        while (h <= h_end) {
            temp = this->calculate(h);
            result[i][0] = h;
            for (j = 0; j < 3; j++) {
                result[i][j + 1] = temp[j];
            }
            h += h_step;
            i++;
        }
        return result;
    }